

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall WriterTest_WriteLongDouble_Test::TestBody(WriterTest_WriteLongDouble_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  longdouble *value;
  char *pcVar4;
  unkbyte10 in_ST1;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  wstring str;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  longdouble *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  WriteChecker<wchar_t> *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  undefined8 in_stack_fffffffffffffe28;
  int line;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  longdouble *in_stack_fffffffffffffe38;
  Type TVar5;
  AssertHelper *in_stack_fffffffffffffe40;
  wstring *this_00;
  AnyWriteChecker *in_stack_fffffffffffffe48;
  Message *in_stack_fffffffffffffe88;
  Message *message;
  undefined2 in_stack_fffffffffffffe90;
  undefined2 uVar6;
  undefined6 in_stack_fffffffffffffe92;
  AssertionResult local_158 [4];
  AssertionResult local_118 [2];
  unkbyte10 local_f8;
  AssertionResult local_d8;
  unkbyte10 local_c8;
  wstring local_b8 [48];
  unkbyte10 local_88;
  AssertionResult local_68 [3];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result;
  undefined6 in_stack_ffffffffffffffd2;
  AssertionResult local_18;
  
  line = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  result = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           _DAT_00338050;
  uVar6 = (undefined2)((unkuint10)_DAT_00338050 >> 0x40);
  (anonymous_namespace)::AnyWriteChecker::operator()
            (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  TVar5 = (Type)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe40);
    testing::AssertionResult::failure_message((AssertionResult *)0x12b0d9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe40,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),line,
               (char *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    testing::Message::~Message((Message *)0x12b136);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12b18b);
  local_88 = _DAT_00338060;
  (anonymous_namespace)::WriteChecker<char>::operator()
            ((WriteChecker<char> *)in_stack_fffffffffffffe18,
             (char *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe40);
    in_stack_fffffffffffffe48 =
         (AnyWriteChecker *)testing::AssertionResult::failure_message((AssertionResult *)0x12b227);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe40,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),line,
               (char *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    testing::Message::~Message((Message *)0x12b284);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12b2dc);
  this_00 = local_b8;
  std::__cxx11::wstring::wstring(this_00);
  local_c8 = _DAT_00338050;
  (anonymous_namespace)::std_format<wchar_t,long_double>
            ((longdouble *)CONCAT62(in_stack_ffffffffffffffd2,uVar6),result);
  value = (longdouble *)std::__cxx11::wstring::operator[]((ulong)local_b8);
  if (*(int *)value == 0x2d) {
    fmt::v5::print<char[61]>
              ((char (*) [61])CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  }
  else {
    local_f8 = _DAT_00338060;
    (anonymous_namespace)::WriteChecker<wchar_t>::operator()
              (in_stack_fffffffffffffe18,
               (char *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08);
    in_stack_fffffffffffffe37 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!(bool)in_stack_fffffffffffffe37) {
      testing::Message::Message((Message *)this_00);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x12b3ea);
      line = (int)((ulong)pcVar4 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,(Type)((ulong)value >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),line,
                 (char *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      testing::Message::~Message((Message *)0x12b447);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12b49c);
  }
  std::numeric_limits<long_double>::min();
  (anonymous_namespace)::AnyWriteChecker::operator()
            (in_stack_fffffffffffffe48,(char *)this_00,value);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_118);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x12b549);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)value >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffe20));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    testing::Message::~Message((Message *)0x12b5a6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12b5fb);
  std::numeric_limits<long_double>::max();
  message = (Message *)in_ST1;
  uVar6 = (undefined2)((unkuint10)in_ST1 >> 0x40);
  (anonymous_namespace)::AnyWriteChecker::operator()
            (in_stack_fffffffffffffe48,(char *)this_00,value);
  TVar5 = (Type)((ulong)value >> 0x20);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_158);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x12b693);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffe20));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT62(in_stack_fffffffffffffe92,uVar6),message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffe10));
    testing::Message::~Message((Message *)0x12b6df);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12b72e);
  std::__cxx11::wstring::~wstring(local_b8);
  return;
}

Assistant:

TEST(WriterTest, WriteLongDouble) {
  CHECK_WRITE(4.2l);
  CHECK_WRITE_CHAR(-4.2l);
  std::wstring str;
  std_format(4.2l, str);
  if (str[0] != '-')
    CHECK_WRITE_WCHAR(-4.2l);
  else
    fmt::print("warning: long double formatting with std::swprintf is broken");
  CHECK_WRITE(std::numeric_limits<long double>::min());
  CHECK_WRITE(std::numeric_limits<long double>::max());
}